

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

void __thiscall
PDA::Transducer::Generator::writeFunctionBody
          (Generator *this,wostream *stream,size_t startTokenIndex)

{
  int iVar1;
  pointer pTVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *pvVar6;
  vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *pvVar7;
  Token *__args;
  bool bVar8;
  long lVar9;
  size_t i;
  vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> currentOp;
  vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> local_58;
  wostream *local_38;
  
  local_38 = stream;
  pvVar6 = Tokenizer::tokens(this->m_tokenizer);
  local_58.super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (Token *)0x0;
  local_58.super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (Token *)0x0;
  local_58.super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (Token *)0x0;
  lVar9 = startTokenIndex * 0x14;
  bVar8 = false;
  for (; pvVar7 = Tokenizer::tokens(this->m_tokenizer),
      startTokenIndex !=
      ((long)(pvVar7->
             super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>).
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(pvVar7->
             super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>).
             _M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
      startTokenIndex = startTokenIndex + 1) {
    pTVar2 = (pvVar6->
             super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>).
             _M_impl.super__Vector_impl_data._M_start;
    iVar1 = *(int *)((long)&pTVar2->token + lVar9);
    bVar5 = true;
    if ((iVar1 != 0x76) && (bVar5 = bVar8, bVar8)) {
      if (iVar1 == 0x3b) {
        if ((local_58.
             super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
             _M_impl.super__Vector_impl_data._M_start !=
             local_58.
             super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
             _M_impl.super__Vector_impl_data._M_finish) &&
           (writeAssembledOperation(this,local_38,&local_58),
           local_58.
           super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
           _M_impl.super__Vector_impl_data._M_finish !=
           local_58.
           super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
           _M_impl.super__Vector_impl_data._M_start)) {
          local_58.
          super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_58.
               super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
      }
      else {
        if (iVar1 == 0x7d) break;
        __args = (Token *)((long)&pTVar2->token + lVar9);
        if (local_58.
            super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_58.
            super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<PDA::Transducer::Token,std::allocator<PDA::Transducer::Token>>::
          _M_realloc_insert<PDA::Transducer::Token_const&>
                    ((vector<PDA::Transducer::Token,std::allocator<PDA::Transducer::Token>> *)
                     &local_58,
                     (iterator)
                     local_58.
                     super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                     ._M_impl.super__Vector_impl_data._M_finish,__args);
        }
        else {
          (local_58.
           super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
           _M_impl.super__Vector_impl_data._M_finish)->identifierIdx = __args->identifierIdx;
          iVar1 = __args->position;
          iVar3 = __args->line;
          iVar4 = __args->fileIndex;
          (local_58.
           super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
           _M_impl.super__Vector_impl_data._M_finish)->token = __args->token;
          (local_58.
           super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
           _M_impl.super__Vector_impl_data._M_finish)->position = iVar1;
          (local_58.
           super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
           _M_impl.super__Vector_impl_data._M_finish)->line = iVar3;
          (local_58.
           super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
           _M_impl.super__Vector_impl_data._M_finish)->fileIndex = iVar4;
          local_58.
          super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_58.
               super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
    }
    bVar8 = bVar5;
    lVar9 = lVar9 + 0x14;
  }
  if (local_58.super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_58.super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    writeAssembledOperation(this,local_38,&local_58);
  }
  if (local_58.super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
      _M_impl.super__Vector_impl_data._M_start != (Token *)0x0) {
    operator_delete(local_58.
                    super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Generator::writeFunctionBody(std::wostream &stream, const size_t startTokenIndex)
{
    bool started = false;
    const std::vector<Token> &tokens = m_tokenizer.tokens();
    std::vector<Token> currentOp;
    for(size_t i = startTokenIndex; i != m_tokenizer.tokens().size(); ++i)
    {
        if (tokens[i].token == L'v')
        {
            started = true;
            continue;
        }
        if (!started)
            continue;
        //checking for end
        if (tokens[i].token == L'}')
            break;
        // splitting
        if (tokens[i].token == L';')
        {
            if (!currentOp.empty())
            {
                writeAssembledOperation(stream, currentOp);
                currentOp.clear();
            }
        }
        else
            currentOp.push_back(tokens[i]);
    }
    if (!currentOp.empty())
        writeAssembledOperation(stream, currentOp);
}